

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linear_hash.c
# Opt level: O2

void test_linear_hash_correct_bucket_after_split(planck_unit_test_t *tc)

{
  ion_byte_t *piVar1;
  array_list_t *paVar2;
  undefined8 uVar3;
  long lVar4;
  planck_unit_result_t pVar5;
  int iVar6;
  linear_hash_table_t *linear_hash;
  ion_fpos_t iVar7;
  ulong uVar8;
  ion_fpos_t iVar9;
  ion_byte_t *key;
  undefined8 auStack_70 [3];
  ion_byte_t aiStack_58 [8];
  undefined4 local_50;
  undefined4 local_4c;
  ion_byte_t *local_48;
  undefined4 local_3c;
  undefined4 local_38;
  int local_34;
  
  auStack_70[2] = 0x101cf3;
  linear_hash = (linear_hash_table_t *)malloc(0x78);
  auStack_70[2] = 0x101d01;
  test_linear_hash_setup(tc,linear_hash);
  local_34 = ((linear_hash->num_buckets + 1) * linear_hash->records_per_bucket *
             linear_hash->split_threshold) / 100;
  auStack_70[2] = 0x101d25;
  iVar7 = array_list_get(0,linear_hash->bucket_map);
  uVar8 = (long)(linear_hash->super).record.key_size + 0xfU & 0xfffffffffffffff0;
  lVar4 = -uVar8;
  key = aiStack_58 + lVar4;
  piVar1 = aiStack_58 + -uVar8;
  piVar1[0] = '\x02';
  piVar1[1] = '\0';
  piVar1[2] = '\0';
  piVar1[3] = '\0';
  *(undefined8 *)((long)auStack_70 + lVar4 + 0x10) = 0x101d55;
  iVar6 = insert_hash_to_bucket(key,linear_hash);
  if (iVar6 < linear_hash->next_split) {
    *(undefined8 *)((long)auStack_70 + lVar4 + 0x10) = 0x101d66;
    iVar6 = hash_to_bucket(key,linear_hash);
  }
  paVar2 = linear_hash->bucket_map;
  local_48 = key;
  *(undefined8 *)((long)auStack_70 + lVar4 + 0x10) = 0x101d78;
  iVar9 = array_list_get(iVar6,paVar2);
  *(undefined8 *)((long)auStack_70 + lVar4 + 0x10) = 0x101d9f;
  pVar5 = planck_unit_assert_true
                    (tc,(uint)(iVar7 == iVar9),0x182,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/linear_hash/test_linear_hash.c"
                     ,"condition was false, expected true");
  if (pVar5 != '\0') {
    *(undefined8 *)((long)auStack_70 + lVar4 + 0x10) = 1;
    uVar3 = *(undefined8 *)((long)auStack_70 + lVar4 + 0x10);
    for (iVar6 = 0; iVar6 < local_34; iVar6 = iVar6 + 1) {
      local_3c = 2;
      local_38 = 5;
      *(linear_hash_table_t **)((long)auStack_70 + lVar4 + 8) = linear_hash;
      *(undefined8 *)((long)auStack_70 + lVar4) = 0x101de2;
      test_linear_hash_insert
                (tc,&local_3c,&local_38,'\0',(ion_result_count_t)uVar3,(ion_boolean_t)uVar3,
                 *(linear_hash_table_t **)((long)auStack_70 + lVar4 + 8));
    }
    local_50 = 2;
    local_4c = 5;
    *(undefined8 *)((long)auStack_70 + lVar4 + 8) = 1;
    uVar3 = *(undefined8 *)((long)auStack_70 + lVar4 + 8);
    *(linear_hash_table_t **)((long)auStack_70 + lVar4 + 8) = linear_hash;
    *(undefined8 *)((long)auStack_70 + lVar4) = 0x101e17;
    test_linear_hash_insert
              (tc,&local_50,&local_4c,'\0',(ion_result_count_t)uVar3,(ion_boolean_t)uVar3,
               *(linear_hash_table_t **)((long)auStack_70 + lVar4 + 8));
    paVar2 = linear_hash->bucket_map;
    *(undefined8 *)((long)auStack_70 + lVar4 + 0x10) = 0x101e26;
    iVar7 = array_list_get(0,paVar2);
    piVar1 = local_48;
    *(undefined8 *)((long)auStack_70 + lVar4 + 0x10) = 0x101e38;
    iVar6 = insert_hash_to_bucket(piVar1,linear_hash);
    if (iVar6 < linear_hash->next_split) {
      *(undefined8 *)((long)auStack_70 + lVar4 + 0x10) = 0x101e49;
      iVar6 = hash_to_bucket(piVar1,linear_hash);
    }
    paVar2 = linear_hash->bucket_map;
    *(undefined8 *)((long)auStack_70 + lVar4 + 0x10) = 0x101e54;
    iVar9 = array_list_get(iVar6,paVar2);
    *(undefined8 *)((long)auStack_70 + lVar4 + 0x10) = 0x101e78;
    pVar5 = planck_unit_assert_true
                      (tc,(uint)(iVar7 == iVar9),0x199,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/linear_hash/test_linear_hash.c"
                       ,"condition was false, expected true");
    if (pVar5 != '\0') {
      *(undefined8 *)((long)auStack_70 + lVar4 + 0x10) = 0x101e87;
      test_linear_hash_destroy(tc,linear_hash);
      return;
    }
  }
  *(undefined8 *)((long)auStack_70 + lVar4 + 0x10) = 1;
  uVar3 = *(undefined8 *)((long)auStack_70 + lVar4 + 0x10);
  *(code **)((long)auStack_70 + lVar4 + 0x10) = test_linear_hash_global_record_increments_decrements
  ;
  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,(int)uVar3);
}

Assistant:

void
test_linear_hash_correct_bucket_after_split(
	planck_unit_test_t *tc
) {
	linear_hash_table_t *linear_hash = malloc(sizeof(linear_hash_table_t));

	test_linear_hash_setup(tc, linear_hash);

	double split_cardinality				= linear_hash->records_per_bucket * (linear_hash->num_buckets + 1) * linear_hash->split_threshold / 100;

	/* assuming initial size of 5 so that key 5 hashes to bucket 0 using h0 */
	int			expected_hash_bucket		= 0;
	ion_fpos_t	expected_bucket_location	= array_list_get(expected_hash_bucket, linear_hash->bucket_map);

	int *k									= alloca(sizeof(int));

	*k = 2;

	ion_byte_t *hash_key = alloca(linear_hash->super.record.key_size);

	memcpy(hash_key, k, sizeof(linear_hash->super.record.key_size));

	/* resolve bucket key 5 hashes to given the current linear_hash state - should be 0 */
	int hash_idx = insert_hash_to_bucket(hash_key, linear_hash);

	if (hash_idx < linear_hash->next_split) {
		hash_idx = hash_to_bucket(hash_key, linear_hash);
	}

	PLANCK_UNIT_ASSERT_TRUE(tc, expected_bucket_location == array_list_get(hash_idx, linear_hash->bucket_map));

	int i;

	/* test while inserting to reach threshold - linear_hash.num_buckets should not change over this range */
	for (i = 0; i < split_cardinality; i++) {
		test_linear_hash_insert(tc, IONIZE(2, int), IONIZE(5, int), err_ok, 1, boolean_true, linear_hash);
	}

	/* test inserting push above threshold - linear_hash.num_buckets should increase by one */
	test_linear_hash_insert(tc, IONIZE(2, int), IONIZE(5, int), err_ok, 1, boolean_true, linear_hash);

	expected_hash_bucket		= 0;
	expected_bucket_location	= array_list_get(expected_hash_bucket, linear_hash->bucket_map);

	/* resolve key 2 hashes to given the current linear_hash state - should be 2 */
	hash_idx					= insert_hash_to_bucket(hash_key, linear_hash);

	if (hash_idx < linear_hash->next_split) {
		hash_idx = hash_to_bucket(hash_key, linear_hash);
	}

	/* assuming initial size of 2 so that key 2 hashes to bucket 2 using h1 */
	PLANCK_UNIT_ASSERT_TRUE(tc, expected_bucket_location == array_list_get(hash_idx, linear_hash->bucket_map));

	test_linear_hash_takedown(tc, linear_hash);
}